

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.h
# Opt level: O0

ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> * __thiscall
AutoArgParse::ComplexFlag<AutoArgParse::DoNothingTrigger>::makeExclusiveGroup
          (ComplexFlag<AutoArgParse::DoNothingTrigger> *this,Policy policy)

{
  size_type __val;
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *pEVar1;
  pointer ppVar2;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unique_ptr<FlagBase>_>_&&>::value,_pair<iterator,_bool>_>
  _Var3;
  unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_> local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>
  local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
  local_78;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unique_ptr<FlagBase>_>_&&>::value,_pair<iterator,_bool>_>
  flagIter;
  string local_58;
  undefined1 local_38 [8];
  string randomName;
  Policy policy_local;
  ComplexFlag<AutoArgParse::DoNothingTrigger> *this_local;
  
  randomName.field_2._12_4_ = policy;
  __val = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>_>
          ::size(&(this->store).flags);
  std::__cxx11::to_string(&local_58,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 RANDOM_STRING_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_58);
  pEVar1 = (ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *)operator_new(0x90);
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveFlagGroup
            (pEVar1,this,randomName.field_2._12_4_);
  std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>::
  unique_ptr<std::default_delete<AutoArgParse::FlagBase>,void>
            ((unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>> *)
             &local_a8,(pointer)pEVar1);
  std::
  make_pair<std::__cxx11::string&,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>
            (&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
             ,&local_a8);
  _Var3 = std::
          unordered_map<std::__cxx11::string,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>>
          ::
          insert<std::pair<std::__cxx11::string,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>
                    ((unordered_map<std::__cxx11::string,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>>
                      *)&(this->store).flags,&local_a0);
  local_78._M_cur =
       (__node_type *)
       _Var3.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
       ._M_cur;
  flagIter.first.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
  ._M_cur._0_1_ = _Var3.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>
  ::~pair(&local_a0);
  std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::~unique_ptr
            (&local_a8);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->store).flagInsertionOrder,(value_type *)local_38);
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>
                         *)&local_78);
  pEVar1 = (ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *)
           std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
           get(&ppVar2->second);
  std::__cxx11::string::~string((string *)local_38);
  return pEVar1;
}

Assistant:

inline ExclusiveFlagGroup<T>& ComplexFlag<T>::makeExclusiveGroup(
    Policy policy) {
    std::string randomName = std::to_string(store.flags.size()) + RANDOM_STRING;
    auto flagIter = store.flags.insert(std::make_pair(
        randomName,
        std::unique_ptr<FlagBase>(new ExclusiveFlagGroup<T>(*this, policy))));
    store.flagInsertionOrder.push_back(randomName);
    return *(static_cast<ExclusiveFlagGroup<T>*>(flagIter.first->second.get()));
}